

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImRect __thiscall ImGuiWindow::TitleBarRect(ImGuiWindow *this)

{
  float fVar1;
  ImRect IVar2;
  
  fVar1 = 0.0;
  if ((this->Flags & 1) == 0) {
    fVar1 = (GImGui->Style).FramePadding.y;
    fVar1 = fVar1 + fVar1 + GImGui->FontBaseSize * this->FontWindowScale;
  }
  IVar2.Max.x = (this->Pos).x + (this->SizeFull).x;
  IVar2.Max.y = (this->Pos).y + fVar1;
  IVar2.Min = this->Pos;
  return IVar2;
}

Assistant:

ImRect      TitleBarRect() const                    { return ImRect(Pos, ImVec2(Pos.x + SizeFull.x, Pos.y + TitleBarHeight())); }